

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Reference_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Reference_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  long lVar1;
  Dispatch_State *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Boxed_Value BVar3;
  Boxed_Value local_30;
  
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node._vptr_AST_Node
       = (_func_int **)0x0;
  local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005a4808
  ;
  local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_30.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
  local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&Type_Info::Unknown_Type::typeinfo;
  *(pointer_____offset_0x10___ **)
   &local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._M_use_count = &Type_Info::Unknown_Type::typeinfo;
  *(undefined4 *)
   &local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._vptr__Sp_counted_base = 0x20;
  *(undefined8 *)
   ((long)&local_30.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi[2]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._M_weak_count = 0;
  *(undefined8 *)
   ((long)&local_30.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi[3]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[3]._M_weak_count = 0;
  *(undefined8 *)
   ((long)&local_30.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi[4]._vptr__Sp_counted_base + 2) = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node.identifier =
       local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node._vptr_AST_Node
       = (_func_int **)
         local_30.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar1 = ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count =
         (local_30.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count = 2;
  }
  chaiscript::detail::Dispatch_State::add_object(in_RDX,(string *)(lVar1 + 0x10),&local_30);
  _Var2._M_pi = extraout_RDX;
  if (local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        Boxed_Value bv;
        t_ss.add_object(this->children[0]->text, bv);
        return bv;
      }